

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxpmhandler.cpp
# Opt level: O3

QVariant * __thiscall
QXpmHandler::option(QVariant *__return_storage_ptr__,QXpmHandler *this,ImageOption option)

{
  QSize QVar1;
  bool bVar2;
  int iVar3;
  
  if (option == Size) {
    if (this->state == Ready) {
      bVar2 = readHeader(this);
      if (bVar2) goto LAB_002baa8f;
    }
    else if (this->state != Error) {
LAB_002baa8f:
      QVar1.wd.m_i = this->width;
      QVar1.ht.m_i = this->height;
      ::QVariant::QVariant(__return_storage_ptr__,QVar1);
      return __return_storage_ptr__;
    }
  }
  else if (option == ImageFormat) {
    if (this->state == Ready) {
      bVar2 = readHeader(this);
      if (bVar2) goto LAB_002baa6f;
    }
    else if (this->state != Error) {
LAB_002baa6f:
      if (this->ncols < 0x101) {
        iVar3 = 3;
      }
      else {
        iVar3 = 0;
      }
      ::QVariant::QVariant(__return_storage_ptr__,iVar3);
      return __return_storage_ptr__;
    }
  }
  else if (option == Name) {
    ::QVariant::QVariant(__return_storage_ptr__,(QString *)&this->fileName);
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
  *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
  return __return_storage_ptr__;
}

Assistant:

QVariant QXpmHandler::option(ImageOption option) const
{
    if (option == Name) {
        return fileName;
    } else if (option == Size) {
        if (state == Error)
            return QVariant();
        if (state == Ready && !const_cast<QXpmHandler*>(this)->readHeader())
            return QVariant();
        return QSize(width, height);
    } else if (option == ImageFormat) {
        if (state == Error)
            return QVariant();
        if (state == Ready && !const_cast<QXpmHandler*>(this)->readHeader())
            return QVariant();
        // If we have more than 256 colors in the table, we need to
        // figure out, if it contains transparency. That means reading
        // the whole color table, which is too much work work pre-checking
        // the image format
        if (ncols <= 256)
            return QImage::Format_Indexed8;
        else
            return QImage::Format_Invalid;
    }

    return QVariant();
}